

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::add_tess_level_input_to_interface_block
          (CompilerMSL *this,string *ib_var_ref,SPIRType *ib_type,SPIRVariable *var)

{
  ID *pIVar1;
  ID id;
  size_t sVar2;
  pointer pcVar3;
  string *psVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t id_00;
  uint32_t uVar7;
  SPIRFunction *pSVar8;
  SPIRType *pSVar9;
  SPIREntryPoint *pSVar10;
  long *plVar11;
  mapped_type *pmVar12;
  Bitset *pBVar13;
  size_type sVar14;
  mapped_type *pmVar15;
  _Manager_type *pp_Var16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  _Alloc_hider _Var18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string mbr_name;
  string qual_var_name;
  _Any_data local_e8;
  _Manager_type local_d8;
  code *pcStack_d0;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_c0;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined1 local_98 [16];
  _Manager_type local_88;
  _Manager_type local_80;
  undefined1 local_78;
  undefined7 uStack_77;
  _Manager_type p_Stack_70;
  string local_68;
  ID *local_48;
  string *local_40;
  SPIRType *local_38;
  
  local_40 = ib_var_ref;
  pSVar8 = Variant::get<spirv_cross::SPIRFunction>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  pSVar9 = Compiler::get_variable_element_type((Compiler *)this,var);
  uVar5 = Compiler::get_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  id.id = (var->super_IVariant).self.id;
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])((string *)local_b8,this);
  Compiler::set_name((Compiler *)this,id,(string *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_);
  }
  pIVar1 = &(var->super_IVariant).self;
  pSVar10 = Compiler::get_entry_point((Compiler *)this);
  local_48 = pIVar1;
  if (((pSVar10->flags).lower & 0x400000) == 0) {
    local_c0 = &ib_type->member_types;
    uVar7 = (uint32_t)
            (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    uVar6 = build_extended_vector_type
                      (this,(pSVar9->super_IVariant).self.id,(uint)(uVar5 == 0xb) * 2 + 2,Unknown);
    id_00 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    pSVar9 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + uVar6);
    local_38 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                         ((Compiler *)this,id_00,pSVar9);
    local_38->pointer = true;
    local_38->storage = StorageClassInput;
    (local_38->parent_type).id = uVar6;
    *(uint32_t *)&(var->super_IVariant).field_0xc = id_00;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
              (local_c0,(ib_type->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size +
                        1);
    sVar2 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
    [sVar2].id = uVar6;
    (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
    buffer_size = sVar2 + 1;
    CompilerGLSL::to_expression_abi_cxx11_
              ((string *)local_b8,&this->super_CompilerGLSL,(var->super_IVariant).self.id,true);
    Compiler::set_member_name
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,(string *)local_b8);
    pcVar3 = (local_40->_M_dataplus)._M_p;
    local_e8._M_unused._M_object = &local_d8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar3,pcVar3 + local_40->_M_string_length);
    ::std::__cxx11::string::append(local_e8._M_pod_data);
    pIVar1 = local_48;
    plVar11 = (long *)::std::__cxx11::string::_M_append(local_e8._M_pod_data,local_b8._0_8_);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar17) {
      local_68.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_68.field_2._8_8_ = plVar11[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_68._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_68._M_string_length = plVar11[1];
    *plVar11 = (long)paVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((_Manager_type *)local_e8._M_unused._0_8_ != &local_d8) {
      operator_delete(local_e8._M_unused._M_object);
    }
    pmVar12 = ::std::__detail::
              _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,pIVar1);
    ::std::__cxx11::string::_M_assign((string *)&(pmVar12->decoration).qualified_alias);
    pBVar13 = Compiler::get_decoration_bitset((Compiler *)this,(ID)pIVar1->id);
    if ((pBVar13->lower & 0x40000000) == 0) {
      local_e8._0_4_ = uVar5;
      sVar14 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::count(&(this->inputs_by_builtin)._M_h,(key_type *)local_e8._M_pod_data);
      if (sVar14 != 0) {
        pmVar15 = ::std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->inputs_by_builtin,(key_type *)local_e8._M_pod_data);
        uVar5 = pmVar15->location;
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,
                   DecorationLocation,uVar5);
        mark_location_as_used_by_shader(this,uVar5,local_38,StorageClassInput);
      }
    }
    else {
      uVar5 = Compiler::get_decoration((Compiler *)this,(ID)pIVar1->id,DecorationLocation);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,DecorationLocation
                 ,uVar5);
      mark_location_as_used_by_shader(this,uVar5,local_38,StorageClassInput);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    psVar4 = (string *)local_b8;
    _Var18._M_p = (pointer)local_b8._0_8_;
  }
  else {
    uVar7 = pIVar1->id;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
              (&pSVar8->local_variables,
               (pSVar8->local_variables).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size + 1);
    sVar2 = (pSVar8->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
            .buffer_size;
    (pSVar8->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr
    [sVar2].id = uVar7;
    (pSVar8->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
    buffer_size = sVar2 + 1;
    uVar7 = pIVar1->id;
    SmallVector<unsigned_int,_8UL>::reserve
              (&this->vars_needing_early_declaration,
               (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size + 1
              );
    sVar2 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size;
    (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr[sVar2] = uVar7;
    (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size = sVar2 + 1;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"gl_TessLevel","");
    if (this->added_builtin_tess_level == false) {
      uVar7 = (uint32_t)
              (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .buffer_size;
      uVar6 = build_extended_vector_type(this,(pSVar9->super_IVariant).self.id,4,Unknown);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                (&ib_type->member_types,
                 (ib_type->member_types).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size + 1);
      sVar2 = (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .buffer_size;
      (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
      [sVar2].id = uVar6;
      (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
      buffer_size = sVar2 + 1;
      Compiler::set_member_name
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar7,&local_68);
      pBVar13 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_48->id);
      local_c0 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                 CONCAT44(local_c0._4_4_,uVar7);
      if ((pBVar13->lower & 0x40000000) == 0) {
        local_b8._0_4_ = uVar5;
        sVar14 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count(&(this->inputs_by_builtin)._M_h,(key_type *)local_b8);
        if (sVar14 != 0) {
          pmVar15 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->inputs_by_builtin,(key_type *)local_b8);
          uVar7 = pmVar15->location;
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_c0,
                     DecorationLocation,uVar7);
          mark_location_as_used_by_shader(this,uVar7,pSVar9,StorageClassInput);
        }
      }
      else {
        uVar7 = Compiler::get_decoration((Compiler *)this,(ID)local_48->id,DecorationLocation);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,(uint32_t)local_c0,
                   DecorationLocation,uVar7);
        mark_location_as_used_by_shader(this,uVar7,pSVar9,StorageClassInput);
      }
      this->added_builtin_tess_level = true;
    }
    local_b8._8_8_ = this;
    if (uVar5 == 0xc) {
      local_a8._M_allocated_capacity = (size_type)local_98;
      pcVar3 = (local_40->_M_dataplus)._M_p;
      local_b8._0_8_ = var;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)(local_b8 + 0x10),pcVar3,pcVar3 + local_40->_M_string_length);
      local_88 = (_Manager_type)&local_78;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_68._M_dataplus._M_p,
                 local_68._M_dataplus._M_p + local_68._M_string_length);
      local_d8 = (_Manager_type)0x0;
      pcStack_d0 = (code *)0x0;
      local_e8._M_unused._M_object = (void *)0x0;
      local_e8._8_8_ = 0;
      pp_Var16 = (_Manager_type *)operator_new(0x50);
      *(undefined4 *)pp_Var16 = local_b8._0_4_;
      *(undefined4 *)((long)pp_Var16 + 4) = local_b8._4_4_;
      *(undefined4 *)(pp_Var16 + 1) = local_b8._8_4_;
      *(undefined4 *)((long)pp_Var16 + 0xc) = local_b8._12_4_;
      pp_Var16[2] = (_Manager_type)(pp_Var16 + 4);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)(pp_Var16 + 2),local_a8._M_allocated_capacity,
                 (undefined1 *)(local_a8._8_8_ + local_a8._M_allocated_capacity));
      pp_Var16[6] = (_Manager_type)(pp_Var16 + 8);
      if (local_88 == (_Manager_type)&local_78) {
        pp_Var16[8] = (_Manager_type)CONCAT71(uStack_77,local_78);
        pp_Var16[9] = p_Stack_70;
      }
      else {
        pp_Var16[6] = local_88;
        pp_Var16[8] = (_Manager_type)CONCAT71(uStack_77,local_78);
      }
      pp_Var16[7] = local_80;
      local_80 = (_Manager_type)0x0;
      local_78 = (_func_bool__Any_data_ptr__Any_data_ptr__Manager_operation)0x0;
      pcStack_d0 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2440:8)>
                   ::_M_invoke;
      local_d8 = ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2440:8)>
                 ::_M_manager;
      local_e8._M_unused._0_8_ = pp_Var16;
      local_88 = (_Manager_type)&local_78;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&pSVar8->fixup_hooks_in,(function<void_()> *)&local_e8);
      if (local_d8 != (_Manager_type)0x0) {
        (*local_d8)(&local_e8,&local_e8,__destroy_functor);
      }
    }
    else {
      if (uVar5 != 0xb) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x98c,
                      "void spirv_cross::CompilerMSL::add_tess_level_input_to_interface_block(const std::string &, SPIRType &, SPIRVariable &)"
                     );
      }
      local_a8._M_allocated_capacity = (size_type)local_98;
      pcVar3 = (local_40->_M_dataplus)._M_p;
      local_b8._0_8_ = var;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)(local_b8 + 0x10),pcVar3,pcVar3 + local_40->_M_string_length);
      local_88 = (_Manager_type)&local_78;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_68._M_dataplus._M_p,
                 local_68._M_dataplus._M_p + local_68._M_string_length);
      local_d8 = (_Manager_type)0x0;
      pcStack_d0 = (code *)0x0;
      local_e8._M_unused._M_object = (void *)0x0;
      local_e8._8_8_ = 0;
      pp_Var16 = (_Manager_type *)operator_new(0x50);
      *(undefined4 *)pp_Var16 = local_b8._0_4_;
      *(undefined4 *)((long)pp_Var16 + 4) = local_b8._4_4_;
      *(undefined4 *)(pp_Var16 + 1) = local_b8._8_4_;
      *(undefined4 *)((long)pp_Var16 + 0xc) = local_b8._12_4_;
      pp_Var16[2] = (_Manager_type)(pp_Var16 + 4);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)(pp_Var16 + 2),local_a8._M_allocated_capacity,
                 (undefined1 *)(local_a8._8_8_ + local_a8._M_allocated_capacity));
      pp_Var16[6] = (_Manager_type)(pp_Var16 + 8);
      if (local_88 == (_Manager_type)&local_78) {
        pp_Var16[8] = (_Manager_type)CONCAT71(uStack_77,local_78);
        pp_Var16[9] = p_Stack_70;
      }
      else {
        pp_Var16[6] = local_88;
        pp_Var16[8] = (_Manager_type)CONCAT71(uStack_77,local_78);
      }
      pp_Var16[7] = local_80;
      local_80 = (_Manager_type)0x0;
      local_78 = (_func_bool__Any_data_ptr__Any_data_ptr__Manager_operation)0x0;
      pcStack_d0 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2431:40)>
                   ::_M_invoke;
      local_d8 = ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2431:40)>
                 ::_M_manager;
      local_e8._M_unused._0_8_ = pp_Var16;
      local_88 = (_Manager_type)&local_78;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&pSVar8->fixup_hooks_in,(function<void_()> *)&local_e8);
      if (local_d8 != (_Manager_type)0x0) {
        (*local_d8)(&local_e8,&local_e8,__destroy_functor);
      }
    }
    if (local_88 != (_Manager_type)&local_78) {
      operator_delete(local_88);
    }
    if ((undefined1 *)local_a8._M_allocated_capacity != local_98) {
      operator_delete((void *)local_a8._M_allocated_capacity);
    }
    psVar4 = &local_68;
    _Var18._M_p = local_68._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var18._M_p != &psVar4->field_2) {
    operator_delete(_Var18._M_p);
  }
  return;
}

Assistant:

void CompilerMSL::add_tess_level_input_to_interface_block(const std::string &ib_var_ref, SPIRType &ib_type,
                                                          SPIRVariable &var)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	auto &var_type = get_variable_element_type(var);

	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));

	// Force the variable to have the proper name.
	set_name(var.self, builtin_to_glsl(builtin, StorageClassFunction));

	if (get_entry_point().flags.get(ExecutionModeTriangles))
	{
		// Triangles are tricky, because we want only one member in the struct.

		// We need to declare the variable early and at entry-point scope.
		entry_func.add_local_variable(var.self);
		vars_needing_early_declaration.push_back(var.self);

		string mbr_name = "gl_TessLevel";

		// If we already added the other one, we can skip this step.
		if (!added_builtin_tess_level)
		{
			// Add a reference to the variable type to the interface struct.
			uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

			uint32_t type_id = build_extended_vector_type(var_type.self, 4);

			ib_type.member_types.push_back(type_id);

			// Give the member a name
			set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

			// There is no qualified alias since we need to flatten the internal array on return.
			if (get_decoration_bitset(var.self).get(DecorationLocation))
			{
				uint32_t locn = get_decoration(var.self, DecorationLocation);
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
				mark_location_as_used_by_shader(locn, var_type, StorageClassInput);
			}
			else if (inputs_by_builtin.count(builtin))
			{
				uint32_t locn = inputs_by_builtin[builtin].location;
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
				mark_location_as_used_by_shader(locn, var_type, StorageClassInput);
			}

			added_builtin_tess_level = true;
		}

		switch (builtin)
		{
		case BuiltInTessLevelOuter:
			entry_func.fixup_hooks_in.push_back([=, &var]() {
				statement(to_name(var.self), "[0] = ", ib_var_ref, ".", mbr_name, ".x;");
				statement(to_name(var.self), "[1] = ", ib_var_ref, ".", mbr_name, ".y;");
				statement(to_name(var.self), "[2] = ", ib_var_ref, ".", mbr_name, ".z;");
			});
			break;

		case BuiltInTessLevelInner:
			entry_func.fixup_hooks_in.push_back(
			    [=, &var]() { statement(to_name(var.self), "[0] = ", ib_var_ref, ".", mbr_name, ".w;"); });
			break;

		default:
			assert(false);
			break;
		}
	}
	else
	{
		// Add a reference to the variable type to the interface struct.
		uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

		uint32_t type_id = build_extended_vector_type(var_type.self, builtin == BuiltInTessLevelOuter ? 4 : 2);
		// Change the type of the variable, too.
		uint32_t ptr_type_id = ir.increase_bound_by(1);
		auto &new_var_type = set<SPIRType>(ptr_type_id, get<SPIRType>(type_id));
		new_var_type.pointer = true;
		new_var_type.storage = StorageClassInput;
		new_var_type.parent_type = type_id;
		var.basetype = ptr_type_id;

		ib_type.member_types.push_back(type_id);

		// Give the member a name
		string mbr_name = to_expression(var.self);
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

		// Since vectors can be indexed like arrays, there is no need to unpack this. We can
		// just refer to the vector directly. So give it a qualified alias.
		string qual_var_name = ib_var_ref + "." + mbr_name;
		ir.meta[var.self].decoration.qualified_alias = qual_var_name;

		if (get_decoration_bitset(var.self).get(DecorationLocation))
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, new_var_type, StorageClassInput);
		}
		else if (inputs_by_builtin.count(builtin))
		{
			uint32_t locn = inputs_by_builtin[builtin].location;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, new_var_type, StorageClassInput);
		}
	}
}